

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

void __thiscall OpenSSLWrapper::SslConnection::SSLSetShutdown(SslConnection *this,int iState)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxSsl);
  if (iVar1 == 0) {
    SSL_set_shutdown((SSL *)this->m_ssl,iState);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SslConnection::SSLSetShutdown(int iState)
    {
        lock_guard<mutex> lk(m_mxSsl);
        SSL_set_shutdown(m_ssl, iState);
    }